

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleRsRule(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if ((((kind == Identifier) || (kind == OpenBrace)) || (kind == Or)) ||
     (((kind == CaseKeyword || (kind == IfKeyword)) ||
      ((kind == RandKeyword || (kind == RepeatKeyword)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleRsRule(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenBrace:
        case TokenKind::IfKeyword:
        case TokenKind::RepeatKeyword:
        case TokenKind::CaseKeyword:
        case TokenKind::Identifier:
        case TokenKind::RandKeyword:
        case TokenKind::Or:
            return true;
        default:
            return false;
    }
}